

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<QTextEdit::ExtraSelection*,long_long>
               (ExtraSelection *first,longlong n,ExtraSelection *d_first)

{
  ExtraSelection *pEVar1;
  ExtraSelection *pEVar2;
  ExtraSelection *pEVar3;
  ExtraSelection **ppEVar4;
  ExtraSelection *pEVar5;
  long in_FS_OFFSET;
  Destructor local_58;
  ExtraSelection *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_40;
  local_58.intermediate = (ExtraSelection *)&DAT_aaaaaaaaaaaaaaaa;
  pEVar1 = d_first + n;
  pEVar5 = first;
  pEVar2 = pEVar1;
  if (first < pEVar1) {
    pEVar5 = pEVar1;
    pEVar2 = first;
  }
  local_58.end = d_first;
  local_40 = d_first;
  if (pEVar2 != d_first) {
    do {
      pEVar3 = local_40;
      QTextCursor::QTextCursor(&local_40->cursor,&first->cursor);
      QTextFormat::QTextFormat
                (&(pEVar3->format).super_QTextFormat,&(first->format).super_QTextFormat);
      local_40 = local_40 + 1;
      first = first + 1;
    } while (local_40 != pEVar2);
    d_first = *local_58.iter;
  }
  local_58.iter = &local_58.intermediate;
  local_58.intermediate = d_first;
  for (; pEVar2 = local_40, ppEVar4 = &local_58.end, local_40 != pEVar1; local_40 = local_40 + 1) {
    QTextCursor::operator=(&local_40->cursor,&first->cursor);
    QTextFormat::operator=(&(pEVar2->format).super_QTextFormat,&(first->format).super_QTextFormat);
    first = first + 1;
  }
  while (local_58.iter = ppEVar4, first != pEVar5) {
    QTextFormat::~QTextFormat(&first[-1].format.super_QTextFormat);
    QTextCursor::~QTextCursor(&first[-1].cursor);
    ppEVar4 = local_58.iter;
    first = first + -1;
  }
  q_relocate_overlap_n_left_move<QTextEdit::ExtraSelection_*,_long_long>::Destructor::~Destructor
            (&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}